

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

char ** parseUriList(char *text,int *count)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  char *__s1;
  size_t sVar5;
  char *pcVar6;
  char **__ptr;
  long lVar7;
  char digits [3];
  char local_3b;
  char local_3a;
  undefined1 local_39;
  int *local_38;
  
  *count = 0;
  __ptr = (char **)0x0;
LAB_001154e7:
  do {
    __s1 = strtok(text,"\r\n");
    if (__s1 == (char *)0x0) {
      return __ptr;
    }
    text = (char *)0x0;
  } while (*__s1 == '#');
  iVar4 = strncmp(__s1,"file://",7);
  if (iVar4 == 0) {
    pcVar6 = __s1 + 6;
    do {
      __s1 = pcVar6 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = __s1;
    } while (*pcVar1 != '/');
  }
  iVar4 = *count;
  *count = iVar4 + 1;
  local_38 = count;
  sVar5 = strlen(__s1);
  pcVar6 = (char *)calloc(sVar5 + 1,1);
  __ptr = (char **)realloc(__ptr,(long)iVar4 * 8 + 8);
  __ptr[iVar4] = pcVar6;
  do {
    cVar3 = *__s1;
    if (cVar3 == '%') {
      pcVar1 = __s1 + 1;
      if ((*pcVar1 == '\0') || (pcVar2 = __s1 + 2, *pcVar2 == '\0')) goto LAB_001155b8;
      __s1 = __s1 + 2;
      local_39 = 0;
      local_3b = *pcVar1;
      local_3a = *pcVar2;
      lVar7 = strtol(&local_3b,(char **)0x0,0x10);
      *pcVar6 = (char)lVar7;
    }
    else {
      if (cVar3 == '\0') break;
LAB_001155b8:
      *pcVar6 = cVar3;
    }
    pcVar6 = pcVar6 + 1;
    __s1 = __s1 + 1;
  } while( true );
  text = (char *)0x0;
  count = local_38;
  goto LAB_001154e7;
}

Assistant:

static char** parseUriList(char* text, int* count)
{
    const char* prefix = "file://";
    char** paths = NULL;
    char* line;

    *count = 0;

    while ((line = strtok(text, "\r\n")))
    {
        text = NULL;

        if (line[0] == '#')
            continue;

        if (strncmp(line, prefix, strlen(prefix)) == 0)
        {
            line += strlen(prefix);
            // TODO: Validate hostname
            while (*line != '/')
                line++;
        }

        (*count)++;

        char* path = calloc(strlen(line) + 1, 1);
        paths = realloc(paths, *count * sizeof(char*));
        paths[*count - 1] = path;

        while (*line)
        {
            if (line[0] == '%' && line[1] && line[2])
            {
                const char digits[3] = { line[1], line[2], '\0' };
                *path = strtol(digits, NULL, 16);
                line += 2;
            }
            else
                *path = *line;

            path++;
            line++;
        }
    }

    return paths;
}